

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
::raw_hash_set(raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
               *this)

{
  ctrl_t *pcVar1;
  Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_> local_30;
  WithId<phmap::priv::StatefulTestingEqual> local_28;
  WithId<phmap::priv::StatefulTestingHash> local_20;
  int local_14;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  *local_10;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  *this_local;
  
  local_10 = this;
  pcVar1 = EmptyGroup<std::is_same<phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>,std::allocator<std::pair<int_const,phmap::priv::NonStandardLayout>>>>
                     ();
  this->ctrl_ = pcVar1;
  this->slots_ = (slot_type *)0x0;
  this->size_ = 0;
  this->capacity_ = 0;
  local_14 = 0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::WithId(&local_20);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::WithId(&local_28);
  Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>::Alloc(&local_30,0);
  std::
  tuple<unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ::
  tuple<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_true,_true>
            (&this->settings_,&local_14,(StatefulTestingHash *)&local_20,
             (StatefulTestingEqual *)&local_28,&local_30);
  Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>::~Alloc(&local_30);
  return;
}

Assistant:

raw_hash_set() noexcept(
        std::is_nothrow_default_constructible<hasher>::value&&
        std::is_nothrow_default_constructible<key_equal>::value&&
        std::is_nothrow_default_constructible<allocator_type>::value) {}